

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix * Matrix::multiply(Matrix *m1,Matrix *m2)

{
  size_t sVar1;
  size_t sVar2;
  Matrix *this;
  ostream *poVar3;
  long lVar4;
  size_t i;
  size_t sVar5;
  size_t j;
  size_t sVar6;
  size_t sVar7;
  double dVar8;
  
  sVar1 = m1->rows;
  if (sVar1 == m2->cols) {
    this = (Matrix *)operator_new(0x18);
    Matrix(this,sVar1,sVar1,false);
    sVar1 = this->rows;
    lVar4 = 0;
    for (sVar5 = 0; sVar5 != sVar1; sVar5 = sVar5 + 1) {
      sVar2 = this->cols;
      for (sVar6 = 0; sVar6 != sVar2; sVar6 = sVar6 + 1) {
        dVar8 = 0.0;
        for (sVar7 = 0; m1->cols != sVar7; sVar7 = sVar7 + 1) {
          dVar8 = dVar8 + *(double *)((long)m1->data + sVar7 * 8 + lVar4 * m1->cols) *
                          m2->data[m2->cols * sVar7 + sVar6];
        }
        this->data[sVar2 * sVar5 + sVar6] = dVar8;
      }
      lVar4 = lVar4 + 8;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Parameter 1 ROWS don\'t match Parameter 2 COLS")
    ;
    std::endl<char,std::char_traits<char>>(poVar3);
    this = (Matrix *)0x0;
  }
  return this;
}

Assistant:

Matrix* Matrix::multiply(Matrix* m1, Matrix* m2) {
	if (m1->rows != m2->cols) {
		std::cout << "Parameter 1 ROWS don't match Parameter 2 COLS" << std::endl;
		return nullptr;
	}

	Matrix* matrix = new Matrix(m1->rows, m2->cols);
	for (size_t i = 0; i < matrix->rows; i++) {
		for (size_t j = 0; j < matrix->cols; j++) {
			double sum = 0;
			for (size_t k = 0; k < m1->cols; k++) {
				sum += m1->data[i * m1->cols + k] * m2->data[k * m2->cols + j];
			}
			matrix->data[i * matrix->cols + j] = sum;
		}
	}
	return matrix;
}